

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buflist.c
# Opt level: O2

int lws_buflist_destroy_segment(lws_buflist **head)

{
  lws_buflist *ptr;
  
  ptr = *head;
  if (ptr != (lws_buflist *)0x0) {
    *head = ptr->next;
    ptr->next = (lws_buflist *)0x0;
    ptr->len = 0;
    ptr->pos = 0;
    lws_realloc(ptr,0,"lws_free");
    return (int)(*head == (lws_buflist *)0x0);
  }
  __assert_fail("*head",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core/buflist.c"
                ,0x57,"int lws_buflist_destroy_segment(struct lws_buflist **)");
}

Assistant:

static int
lws_buflist_destroy_segment(struct lws_buflist **head)
{
	struct lws_buflist *old = *head;

	assert(*head);
	*head = old->next;
	old->next = NULL;
	old->pos = old->len = 0;
	lws_free(old);

	return !*head; /* returns 1 if last segment just destroyed */
}